

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O2

symNodePtr __thiscall dh::symTab::research_elem_global(symTab *this,string *c)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  symNodePtr sVar2;
  symNodePtr tmp_ptr;
  long local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  research_elem((symTab *)&stack0xffffffffffffffd0,c);
  _Var1._M_pi = local_28._M_pi;
  if (local_30 == 0) {
    if ((string *)c->_M_string_length == (string *)0x0) {
      *(undefined8 *)this = 0;
      (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      research_elem_global(this,(string *)c->_M_string_length);
    }
  }
  else {
    *(long *)this = local_30;
    local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->upper_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    local_30 = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffd8);
  sVar2.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (symNodePtr)sVar2.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

symNodePtr symTab::research_elem_global( const ::std::string& c)
{
	auto tmp_ptr = research_elem(c);
	if ( tmp_ptr == nullptr)
	{
		if ( this->upper_tab == nullptr)
		{
			return nullptr;
		}
		return this->upper_tab->research_elem_global(c);
	} else 
	{
		return tmp_ptr;
	}
}